

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O3

bool __thiscall
sptk::reaper::EpochTracker::GetBandpassedRmsSignal
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float sample_rate,
          float low_limit,float high_limit,float frame_interval,float frame_dur,
          vector<float,_std::allocator<float>_> *output_rms)

{
  size_t __n;
  pointer pfVar1;
  undefined1 auVar2 [16];
  int iVar3;
  float *output;
  float *y;
  ulong uVar4;
  ulong uVar5;
  ulong size;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong __new_size;
  float fVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  FFT ft;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  FFT local_50;
  long lVar12;
  
  iVar3 = (int)(frame_interval * sample_rate + 0.5);
  uVar8 = (uint)(frame_dur * sample_rate + 0.5);
  size = (ulong)(int)uVar8;
  iVar6 = 0;
  __new_size = (((long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2) - size) / (ulong)(long)iVar3 + 1;
  if (__new_size < 2) {
    GetBandpassedRmsSignal();
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize(output_rms,__new_size);
    do {
      iVar6 = iVar6 + 1;
    } while (1 << ((byte)iVar6 & 0x1f) < (int)uVar8);
    FFT::FFT(&local_50,iVar6);
    uVar7 = 0xffffffffffffffff;
    if (-1 < (long)local_50.fftSize) {
      uVar7 = (long)local_50.fftSize * 4;
    }
    output = (float *)operator_new__(uVar7);
    y = (float *)operator_new__(uVar7);
    uVar7 = (long)iVar3 * 2;
    uVar4 = size / uVar7;
    uVar4 = uVar4 + (uVar7 * uVar4 < size);
    if (uVar4 < __new_size) {
      __n = (ulong)(~uVar8 + local_50.fftSize) * 4 + 4;
      lVar12 = uVar4 - 1;
      auVar15._8_4_ = (int)lVar12;
      auVar15._0_8_ = lVar12;
      auVar15._12_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar15 = auVar15 ^ _DAT_0012bcc0;
      uVar7 = uVar4;
      do {
        Window(this,input,((int)uVar7 - (int)uVar4) * iVar3,size,output);
        if (uVar8 != 0) {
          memset(y,0,size * 4);
        }
        if ((int)uVar8 < local_50.fftSize) {
          memset(y + size,0,__n);
          memset(output + size,0,__n);
        }
        FFT::fft(&local_50,output,y);
        fVar9 = FFT::get_band_rms(&local_50,output,y,
                                  (int)((low_limit * (float)local_50.fftSize) / sample_rate + 0.5),
                                  (int)((high_limit * (float)local_50.fftSize) / sample_rate + 0.5))
        ;
        dVar10 = log10((double)fVar9 + 1.0);
        fVar9 = (float)(dVar10 * 20.0);
        pfVar1 = (output_rms->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar1[uVar7] = fVar9;
        auVar2 = _DAT_0012bcc0;
        local_98 = auVar15._0_4_;
        iStack_94 = auVar15._4_4_;
        iStack_90 = auVar15._8_4_;
        iStack_8c = auVar15._12_4_;
        if (uVar7 == uVar4 && uVar4 != 0) {
          uVar5 = 0;
          auVar11 = _DAT_0012bcb0;
          auVar13 = _DAT_0012bf60;
          do {
            auVar14 = auVar11 ^ auVar2;
            if ((bool)(~(auVar14._4_4_ == iStack_94 && local_98 < auVar14._0_4_ ||
                        iStack_94 < auVar14._4_4_) & 1)) {
              pfVar1[uVar5] = fVar9;
            }
            if ((auVar14._12_4_ != iStack_8c || auVar14._8_4_ <= iStack_90) &&
                auVar14._12_4_ <= iStack_8c) {
              pfVar1[uVar5 + 1] = fVar9;
            }
            auVar14 = auVar13 ^ auVar2;
            iVar6 = auVar14._4_4_;
            if (iVar6 <= iStack_94 && (iVar6 != iStack_94 || auVar14._0_4_ <= local_98)) {
              pfVar1[uVar5 + 2] = fVar9;
              pfVar1[uVar5 + 3] = fVar9;
            }
            uVar5 = uVar5 + 4;
            lVar12 = auVar11._8_8_;
            auVar11._0_8_ = auVar11._0_8_ + 4;
            auVar11._8_8_ = lVar12 + 4;
            lVar12 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 4;
            auVar13._8_8_ = lVar12 + 4;
          } while ((uVar4 + 3 & 0xfffffffffffffffc) != uVar5);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < __new_size);
    }
    operator_delete__(output);
    operator_delete__(y);
    FFT::~FFT(&local_50);
  }
  return 1 < __new_size;
}

Assistant:

bool EpochTracker::GetBandpassedRmsSignal(const std::vector<float>& input,
                                          float sample_rate,
                                          float low_limit, float high_limit,
                                          float frame_interval,
                                          float frame_dur,
                                          std::vector<float>* output_rms) {
  size_t frame_step = RoundUp(sample_rate * frame_interval);
  size_t frame_size = RoundUp(sample_rate * frame_dur);
  size_t n_frames = 1 + ((input.size() - frame_size) / frame_step);
  if (n_frames < 2) {
    fprintf(stderr, "input too small (%d) in GetBandpassedRmsSignal\n",
            static_cast<int>(input.size()));
    output_rms->resize(0);
    return false;
  }
  output_rms->resize(n_frames);
  FFT ft(FFT::fft_pow2_from_window_size(frame_size));
  int32_t fft_size = ft.get_fftSize();
  int32_t first_bin = RoundUp(fft_size * low_limit / sample_rate);
  int32_t last_bin = RoundUp(fft_size * high_limit / sample_rate);
  float* re = new float[fft_size];
  float* im = new float[fft_size];
  size_t first_frame = frame_size / (2 * frame_step);
  if ((first_frame * 2 * frame_step) < frame_size) {
    first_frame++;
  }
  for (size_t frame = first_frame; frame < n_frames; ++frame) {
    Window(input, (frame - first_frame) * frame_step, frame_size, re);
    for (size_t i = 0; i < frame_size; ++i) {
      im[i] = 0.0;
    }
    for (int32_t i = frame_size; i < fft_size; ++i) {
      re[i] = im[i] = 0.0;
    }
    ft.fft(re, im);
    float rms = 20.0 *
        log10(1.0 + ft.get_band_rms(re, im, first_bin, last_bin));
    (*output_rms)[frame] = rms;
    if (frame == first_frame) {
      for (size_t bframe = 0; bframe < first_frame; ++bframe) {
        (*output_rms)[bframe] = rms;
      }
    }
  }
  delete [] re;
  delete [] im;
  return true;
}